

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O2

QMap<int,_QVariant> __thiscall InsertProxyModel::itemData(InsertProxyModel *this,QModelIndex *index)

{
  int iVar1;
  int iVar2;
  QAbstractItemModel *pQVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long *plVar8;
  long *plVar9;
  int *piVar10;
  byte bVar11;
  QModelIndex *in_RDX;
  byte bVar12;
  QModelIndex local_60;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  bVar4 = QModelIndex::isValid(in_RDX);
  if ((bVar4) && (lVar7 = QAbstractProxyModel::sourceModel(), lVar7 != 0)) {
    plVar8 = (long *)QAbstractProxyModel::sourceModel();
    local_60.r = -1;
    local_60.c = -1;
    local_60.i = 0;
    local_60.m = (QAbstractItemModel *)0x0;
    iVar5 = (**(code **)(*plVar8 + 0x78))(plVar8,&local_60);
    plVar8 = (long *)QAbstractProxyModel::sourceModel();
    local_60.r = -1;
    local_60.c = -1;
    local_60.i = 0;
    local_60.m = (QAbstractItemModel *)0x0;
    iVar6 = (**(code **)(*plVar8 + 0x80))(plVar8,&local_60);
    pQVar3 = index->m;
    QModelIndex::parent(&local_60,in_RDX);
    if ((((local_60.r < 0) ||
         (((long)local_60._0_8_ < 0 || (local_60.m == (QAbstractItemModel *)0x0)))) &&
        (iVar1 = in_RDX->r, iVar1 <= iVar5)) &&
       (((iVar2 = in_RDX->c, iVar2 <= iVar6 && ((iVar1 != iVar5 || (((byte)*pQVar3 & 1) != 0)))) &&
        ((iVar2 != iVar6 || (((byte)*pQVar3 & 2) != 0)))))) {
      if (iVar1 == iVar5) {
        bVar11 = (byte)*pQVar3 & 1;
      }
      else {
        bVar11 = 0;
      }
      if (iVar2 == iVar6) {
        bVar12 = ((byte)*pQVar3 & 2) >> 1;
      }
      else {
        bVar12 = 0;
      }
      if (bVar11 != 0 || bVar12 != 0) {
        if ((bVar12 & bVar11) == 1) {
          piVar10 = *(int **)(pQVar3 + 0xa8);
        }
        else {
          if (bVar11 != 0) {
            iVar1 = iVar2;
          }
          piVar10 = *(int **)(*(long *)(pQVar3 + (ulong)bVar11 * 0x18 + 0x70) + (long)iVar1 * 8);
        }
        *(int **)this = piVar10;
        if (piVar10 == (int *)0x0) {
          return (QMap<int,_QVariant>)
                 (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                  )this;
        }
        LOCK();
        *piVar10 = *piVar10 + 1;
        UNLOCK();
        return (QMap<int,_QVariant>)
               (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                )this;
      }
      plVar8 = (long *)QAbstractProxyModel::sourceModel();
      plVar9 = (long *)QAbstractProxyModel::sourceModel();
      local_48 = 0xffffffffffffffff;
      local_40 = 0;
      uStack_38 = 0;
      (**(code **)(*plVar9 + 0x60))(&local_60,plVar9,in_RDX->r,in_RDX->c);
      (**(code **)(*plVar8 + 0xb0))(this,plVar8,&local_60);
      return (QMap<int,_QVariant>)
             (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
              )this;
    }
  }
  *(undefined8 *)this = 0;
  return (QMap<int,_QVariant>)
         (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
          )this;
}

Assistant:

QMap<int, QVariant> InsertProxyModel::itemData(const QModelIndex &index) const
{
    if (!index.isValid())
        return QMap<int, QVariant>();
    if (!sourceModel())
        return QMap<int, QVariant>();
    const int sourceRows = sourceModel()->rowCount();
    const int sourceCols = sourceModel()->columnCount();
    Q_D(const InsertProxyModel);
    if (index.parent().isValid() || index.row() > sourceRows || index.column() > sourceCols
        || (index.row() == sourceRows && !(d->m_insertDirection & InsertRow))
        || (index.column() == sourceCols && !(d->m_insertDirection & InsertColumn)))
        return QMap<int, QVariant>();
    const bool isExtraRow = index.row() == sourceRows && d->m_insertDirection & InsertRow;
    const bool isExtraCol = index.column() == sourceCols && d->m_insertDirection & InsertColumn;
    if (!(isExtraRow || isExtraCol))
        return sourceModel()->itemData(sourceModel()->index(index.row(), index.column()));
    if (isExtraRow && isExtraCol)
        return convertFromContainer<QMap<int, QVariant>>(d->m_dataForCorner);
    const int sectionIdx = isExtraRow ? index.column() : index.row();
    return convertFromContainer<QMap<int, QVariant>>(d->m_extraData[isExtraRow][sectionIdx]);
}